

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void * worker_thread_test_evict_get(void *arg)

{
  long lVar1;
  bool bVar2;
  undefined1 local_21;
  ulong uStack_20;
  char vbuf;
  unsigned_long_long n;
  context *ctx;
  void *arg_local;
  
  uStack_20 = (ulong)*arg;
  n = (unsigned_long_long)arg;
  ctx = (context *)arg;
  do {
    bVar2 = false;
    if (keep_running != 0) {
      lVar1 = vmemcache_get(*(undefined8 *)(n + 8),&stack0xffffffffffffffe0,8,&local_21,1,0,0);
      bVar2 = lVar1 == 1;
    }
  } while (bVar2);
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_test_evict_get(void *arg)
{
	struct context *ctx = arg;
	unsigned long long n = ctx->thread_number;

	char vbuf;

	while (__atomic_load_n(&keep_running, __ATOMIC_SEQ_CST) &&
		vmemcache_get(ctx->cache, &n, sizeof(n),
				&vbuf, sizeof(vbuf), 0, NULL) == sizeof(vbuf))
		;

	return NULL;
}